

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_initCStream_usingCDict_advanced
                 (ZSTD_CStream *zcs,ZSTD_CDict *cdict,ZSTD_frameParameters fParams,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  undefined4 in_ECX;
  unsigned_long_long in_RDX;
  ZSTD_CDict *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  ZSTD_customMem in_stack_00000000;
  ZSTD_CCtx_params params;
  undefined8 local_158;
  undefined8 uStackY_150;
  undefined8 local_148;
  undefined8 uStackY_140;
  undefined1 *local_e0;
  ZSTD_compressionParameters local_d4;
  undefined4 local_b8;
  uint uStackY_b4;
  uint uStackY_b0;
  uint uStackY_ac;
  uint uStackY_a8;
  uint uStackY_a4;
  uint uStackY_a0;
  ZSTD_strategy ZStackY_9c;
  undefined4 in_stack_ffffffffffffff74;
  size_t in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  ZSTD_CStream *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  unsigned_long_long pledgedSrcSize_00;
  undefined4 uVar1;
  undefined8 in_stack_fffffffffffffff8;
  size_t sVar2;
  
  if (in_RSI == (ZSTD_CDict *)0x0) {
    sVar2 = 0xffffffffffffffe0;
  }
  else {
    pledgedSrcSize_00 = in_RDX;
    uVar1 = in_ECX;
    memcpy(&local_b8,(void *)(in_RDI + 0x10),0x78);
    ZSTD_getCParamsFromCDict(&local_d4,in_RSI);
    uStackY_b4 = local_d4.windowLog;
    uStackY_b0 = local_d4.chainLog;
    uStackY_ac = local_d4.hashLog;
    uStackY_a8 = local_d4.searchLog;
    uStackY_a4 = local_d4.searchLength;
    uStackY_a0 = local_d4.targetLength;
    ZStackY_9c = local_d4.strategy;
    local_158 = CONCAT44(uStackY_b4,local_b8);
    uStackY_150 = CONCAT44(uStackY_ac,uStackY_b0);
    local_148 = CONCAT44(uStackY_a4,uStackY_a8);
    uStackY_140 = CONCAT44(local_d4.strategy,uStackY_a0);
    params_00.cParams.chainLog = (int)in_stack_ffffffffffffffa8;
    params_00.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    params_00.format = (int)in_stack_ffffffffffffffa0;
    params_00.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
    params_00.cParams.searchLog = (int)in_stack_ffffffffffffffb0;
    params_00.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
    params_00.cParams.targetLength = (int)in_stack_ffffffffffffffb8;
    params_00.cParams.strategy = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    params_00.fParams.contentSizeFlag = (int)in_R8;
    params_00.fParams.checksumFlag = (int)((ulong)in_R8 >> 0x20);
    params_00._40_8_ = in_RSI;
    params_00.disableLiteralCompression = (int)in_RDI;
    params_00.forceWindow = (int)((ulong)in_RDI >> 0x20);
    params_00.nbWorkers = in_stack_ffffffffffffffd8;
    params_00.jobSize = (int)in_RDX;
    params_00.overlapSizeLog = (int)(in_RDX >> 0x20);
    params_00.ldmParams.enableLdm = in_ECX;
    params_00.ldmParams.hashLog = in_stack_ffffffffffffffe8;
    params_00.ldmParams.bucketSizeLog = (int)pledgedSrcSize_00;
    params_00.ldmParams.minMatchLength = (int)(pledgedSrcSize_00 >> 0x20);
    params_00.ldmParams.hashEveryLog = uVar1;
    params_00._88_8_ = in_stack_fffffffffffffff8;
    params_00.customMem = in_stack_00000000;
    local_e0 = (undefined1 *)&local_158;
    sVar2 = ZSTD_initCStream_internal
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                       ,(ZSTD_CDict *)CONCAT44(in_stack_ffffffffffffff74,uVar1),params_00,
                       pledgedSrcSize_00);
  }
  return sVar2;
}

Assistant:

size_t ZSTD_initCStream_usingCDict_advanced(ZSTD_CStream* zcs,
                                            const ZSTD_CDict* cdict,
                                            ZSTD_frameParameters fParams,
                                            unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingCDict_advanced");
    if (!cdict) return ERROR(dictionary_wrong); /* cannot handle NULL cdict (does not know what to do) */
    {   ZSTD_CCtx_params params = zcs->requestedParams;
        params.cParams = ZSTD_getCParamsFromCDict(cdict);
        params.fParams = fParams;
        return ZSTD_initCStream_internal(zcs,
                                NULL, 0, cdict,
                                params, pledgedSrcSize);
    }
}